

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovProgram.cpp
# Opt level: O0

cl_program
cov::createProgramWithSource
          (cl_context context,cl_uint count,char **strings,size_t *lengths,cl_int *errcodeRet)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  Countable<cov::Program> *this;
  Countable<cov::Program> *local_130;
  Program *p;
  Countable<cov::Program> *program;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  ulong local_78;
  size_t i;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_59;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  Context *c;
  cl_int *errcodeRet_local;
  size_t *lengths_local;
  char **strings_local;
  cl_uint count_local;
  cl_context context_local;
  
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)context;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58,(ulong)count,&local_59);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_59);
  local_78 = 0;
  while( true ) {
    uVar2 = local_78;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    if (sVar4 <= uVar2) break;
    if (lengths == (size_t *)0x0) {
      pcVar1 = strings[local_78];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,pcVar1,(allocator<char> *)((long)&program + 7));
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58,local_78);
      std::__cxx11::string::operator=((string *)pvVar5,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&program + 7));
    }
    else {
      pcVar1 = strings[local_78];
      uVar2 = lengths[local_78];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,pcVar1,uVar2,&local_99);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58,local_78);
      std::__cxx11::string::operator=((string *)pvVar5,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    local_78 = local_78 + 1;
  }
  this = (Countable<cov::Program> *)operator_new(0x38,(nothrow_t *)&std::nothrow);
  local_130 = (Countable<cov::Program> *)0x0;
  if (this != (Countable<cov::Program> *)0x0) {
    Countable<cov::Program>::
    Countable<cov::Context,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (this,(Context *)
                    sources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    local_130 = this;
  }
  if (local_130 == (Countable<cov::Program> *)0x0) {
    *errcodeRet = -6;
    context_local = (cl_context)0x0;
  }
  else {
    bVar3 = ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>::initSuccess
                      ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7> *)local_130);
    if (bVar3) {
      *errcodeRet = 0;
      context_local = (cl_context)local_130;
    }
    else {
      ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>::release
                ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7> *)local_130);
      *errcodeRet = -5;
      context_local = (cl_context)0x0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return (cl_program)context_local;
}

Assistant:

cl_program createProgramWithSource(cl_context context,
                                   cl_uint count,
                                   const char** strings,
                                   const size_t* lengths,
                                   cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);

    std::vector<std::string> sources(count);
    for (size_t i = 0; i < sources.size(); i++) {
        if (lengths) {
            sources[i] = std::string(strings[i], lengths[i]);
        } else {
            sources[i] = std::string(strings[i]);
        }
    }
    auto program = new(std::nothrow) Countable<Program>(*c, sources);
    if (!program) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto p = reinterpret_cast<Program*>(program);
    if (!p->initSuccess()) {
        p->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_program*>(p);
}